

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

void set_postproc_filter_default_params(AV1_COMMON *cm)

{
  RestorationInfo *rst_info;
  CdefInfo *cdef_info;
  loopfilter *lf;
  AV1_COMMON *cm_local;
  
  (cm->lf).filter_level[0] = 0;
  (cm->lf).filter_level[1] = 0;
  (cm->lf).backup_filter_level[0] = 0;
  (cm->lf).backup_filter_level[1] = 0;
  (cm->cdef_info).cdef_bits = 0;
  (cm->cdef_info).cdef_strengths[0] = 0;
  (cm->cdef_info).nb_cdef_strengths = 1;
  (cm->cdef_info).cdef_uv_strengths[0] = 0;
  cm->rst_info[0].frame_restoration_type = RESTORE_NONE;
  cm->rst_info[1].frame_restoration_type = RESTORE_NONE;
  cm->rst_info[2].frame_restoration_type = RESTORE_NONE;
  return;
}

Assistant:

static inline void set_postproc_filter_default_params(AV1_COMMON *cm) {
  struct loopfilter *const lf = &cm->lf;
  CdefInfo *const cdef_info = &cm->cdef_info;
  RestorationInfo *const rst_info = cm->rst_info;

  lf->filter_level[0] = 0;
  lf->filter_level[1] = 0;
  lf->backup_filter_level[0] = 0;
  lf->backup_filter_level[1] = 0;
  cdef_info->cdef_bits = 0;
  cdef_info->cdef_strengths[0] = 0;
  cdef_info->nb_cdef_strengths = 1;
  cdef_info->cdef_uv_strengths[0] = 0;
  rst_info[0].frame_restoration_type = RESTORE_NONE;
  rst_info[1].frame_restoration_type = RESTORE_NONE;
  rst_info[2].frame_restoration_type = RESTORE_NONE;
}